

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  byte bVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar2;
  int iVar3;
  int iVar4;
  const_reference pUVar5;
  bool bVar6;
  string_view element_name;
  string_view str;
  UnknownFieldSet intermediate_unknown_fields;
  Type type;
  undefined1 local_68 [24];
  string *local_50;
  OptionInterpreter *local_48;
  const_iterator local_40;
  string *local_38;
  
  local_50 = debug_msg_name;
  local_48 = this;
  iVar3 = internal::SooRep::size
                    ((SooRep *)unknown_fields,
                     (undefined1  [16])
                     ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                     (undefined1  [16])0x4) == (undefined1  [16])0x0);
  bVar6 = iVar3 < 1;
  if (intermediate_fields_iter._M_current == intermediate_fields_end._M_current) {
    if (0 < iVar3) {
      pUVar5 = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,0);
      if (pUVar5->number_ != innermost_field->number_) {
        iVar3 = 1;
        do {
          iVar4 = internal::SooRep::size
                            ((SooRep *)unknown_fields,
                             (undefined1  [16])
                             ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
          bVar6 = iVar4 <= iVar3;
          if (iVar4 <= iVar3) {
            return bVar6;
          }
          pUVar5 = RepeatedField<google::protobuf::UnknownField>::Get
                             (&unknown_fields->fields_,iVar3);
          iVar3 = iVar3 + 1;
        } while (pUVar5->number_ != innermost_field->number_);
      }
      local_68._0_8_ = &local_38;
      local_38 = local_50;
      local_68._8_8_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::FieldDescriptor_const*,std::__cxx11::string_const&,google::protobuf::UnknownFieldSet_const&)::__0,std::__cxx11::string>
      ;
      make_error.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::FieldDescriptor_const*,std::__cxx11::string_const&,google::protobuf::UnknownFieldSet_const&)::__0,std::__cxx11::string>
      ;
      make_error.ptr_.obj = (void *)local_68._0_8_;
      element_name._M_str = (local_48->options_to_interpret_->element_name)._M_dataplus._M_p;
      element_name._M_len = (local_48->options_to_interpret_->element_name)._M_string_length;
      AddError(local_48->builder_,element_name,&local_48->uninterpreted_option_->super_Message,
               OPTION_NAME,make_error);
    }
  }
  else if (0 < iVar3) {
    local_40._M_current = intermediate_fields_iter._M_current + 1;
    iVar3 = 0;
    do {
      pUVar5 = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,iVar3);
      if (pUVar5->number_ == (*intermediate_fields_iter._M_current)->number_) {
        pUVar5 = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,iVar3);
        bVar1 = (*intermediate_fields_iter._M_current)->type_;
        local_38 = (string *)CONCAT44(local_38._4_4_,(uint)bVar1);
        if (bVar1 == 10) {
          if ((pUVar5->type_ == 4) &&
             (bVar2 = ExamineIfOptionIsSet
                                (local_48,local_40,intermediate_fields_end,innermost_field,local_50,
                                 (pUVar5->data_).group), !bVar2)) {
            return bVar6;
          }
        }
        else {
          if (bVar1 != 0xb) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_68,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                       ,0x2679);
            str._M_str = "Invalid wire type for CPPTYPE_MESSAGE: ";
            str._M_len = 0x27;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      ((LogMessage *)local_68,str);
            absl::lts_20250127::log_internal::LogMessage::
            operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>
                      ((LogMessage *)local_68,(Type *)&local_38);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)local_68);
          }
          if (pUVar5->type_ == 3) {
            local_68._0_8_ = 0;
            local_68._8_8_ = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
            if (pUVar5->type_ != 3) {
              __assert_fail("type() == TYPE_LENGTH_DELIMITED",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.h"
                            ,0x170,
                            "absl::string_view google::protobuf::UnknownField::length_delimited() const"
                           );
            }
            bVar2 = UnknownFieldSet::ParseFromArray
                              ((UnknownFieldSet *)local_68,
                               (((pUVar5->data_).string_value)->_M_dataplus)._M_p,
                               (int)((pUVar5->data_).string_value)->_M_string_length);
            if ((bVar2) &&
               (bVar2 = ExamineIfOptionIsSet
                                  (local_48,local_40,intermediate_fields_end,innermost_field,
                                   local_50,(UnknownFieldSet *)local_68), !bVar2)) {
              iVar3 = internal::SooRep::size((SooRep *)local_68,(local_68._0_8_ & 4) == 0);
              if (iVar3 != 0) {
                UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_68);
              }
              RepeatedField<google::protobuf::UnknownField>::~RepeatedField
                        ((RepeatedField<google::protobuf::UnknownField> *)local_68);
              return bVar6;
            }
            iVar4 = internal::SooRep::size((SooRep *)local_68,(local_68._0_8_ & 4) == 0);
            if (iVar4 != 0) {
              UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_68);
            }
            RepeatedField<google::protobuf::UnknownField>::~RepeatedField
                      ((RepeatedField<google::protobuf::UnknownField> *)local_68);
          }
        }
      }
      iVar3 = iVar3 + 1;
      iVar4 = internal::SooRep::size
                        ((SooRep *)unknown_fields,
                         (undefined1  [16])
                         ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
      bVar6 = iVar4 <= iVar3;
    } while (iVar3 < iVar4);
  }
  return bVar6;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const std::string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError([&] {
          return absl::StrCat("Option \"", debug_msg_name,
                              "\" was already set.");
        });
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name, unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}